

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

const_iterator __thiscall PcodeOpBank::end(PcodeOpBank *this,OpCode opc)

{
  long lStack_8;
  
  if (opc == CPUI_STORE) {
    lStack_8 = 0x60;
  }
  else if (opc == CPUI_CALLOTHER) {
    lStack_8 = 0x90;
  }
  else if (opc == CPUI_RETURN) {
    lStack_8 = 0x78;
  }
  else {
    lStack_8 = 0x48;
  }
  return (_List_node_base *)(&(this->optree)._M_t._M_impl.field_0x0 + lStack_8);
}

Assistant:

list<PcodeOp *>::const_iterator PcodeOpBank::end(OpCode opc) const

{
  switch(opc) {
  case CPUI_STORE:
    return storelist.end();
  case CPUI_RETURN:
    return returnlist.end();
  case CPUI_CALLOTHER:
    return useroplist.end();
  default:
    break;
  }
  return alivelist.end();
}